

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jtag.cpp
# Opt level: O1

bool __thiscall Jtag::sendClocks(Jtag *this,unsigned_long cycles)

{
  bool bVar1;
  int iVar2;
  long lVar3;
  BYTE byOutputBuffer [3];
  DWORD dwNumBytesSent;
  undefined1 local_f;
  undefined1 local_e;
  undefined1 local_d;
  undefined1 local_c [4];
  
  if (0x80007 < cycles) {
    bVar1 = sendClocks(this,cycles - 0x80000);
    cycles = 0;
    if (!bVar1) {
      return false;
    }
  }
  local_f = 0x8f;
  lVar3 = (cycles >> 3) - 1;
  local_e = (undefined1)lVar3;
  local_d = (undefined1)((ulong)lVar3 >> 8);
  iVar2 = FT_Write(this->ftHandle,&local_f,3,local_c);
  return iVar2 == 0;
}

Assistant:

bool Jtag::sendClocks(unsigned long cycles) {
	BYTE byOutputBuffer[3];
	DWORD dwNumBytesSent;
	FT_STATUS ftStatus;

	if (cycles / 8 > 65536) {
		if (!sendClocks(cycles - 65536 * 8))
			return false;
		cycles = 65536 * 8;
	}

	cycles /= 8;

	byOutputBuffer[0] = 0x8F;
	byOutputBuffer[1] = (cycles - 1) & 0xff;
	byOutputBuffer[2] = ((cycles - 1) >> 8) & 0xff;
	ftStatus = FT_Write(ftHandle, byOutputBuffer, 3, &dwNumBytesSent);
	if (ftStatus != FT_OK)
		return false;

	return true;
}